

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

char * soplex::
       MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *lp,int idx,NameSet *rnames,char *buf)

{
  Item *pIVar1;
  SPxRowId SVar2;
  
  if (rnames != (NameSet *)0x0) {
    SVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::rId(lp,idx);
    pIVar1 = (rnames->set).theitem;
    if (-1 < pIVar1[(long)SVar2.super_DataKey >> 0x20].info) {
      return rnames->mem + pIVar1[(long)SVar2.super_DataKey >> 0x20].data;
    }
  }
  spxSnprintf(buf,0x10,"C%d",idx);
  return buf;
}

Assistant:

static const char* MPSgetRowName(
   const SPxLPBase<R>& lp,
   int                   idx,
   const NameSet*        rnames,
   char*                 buf
)
{
   assert(buf != nullptr);
   assert(idx >= 0);
   assert(idx <  lp.nRows());

   if(rnames != nullptr)
   {
      DataKey key = lp.rId(idx);

      if(rnames->has(key))
         return (*rnames)[key];
   }

   spxSnprintf(buf, 16, "C%d", idx);

   return buf;
}